

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int vrf_line(order_t *o,int mode)

{
  char *xx_3;
  char *xx_2;
  char *xx_1;
  char *xx;
  int i;
  int mode_local;
  order_t *o_local;
  
  for (i = 0; (long)i < o->lines; i = i + 1) {
    tdefs[5].vtotal =
         o->lineorders[i].suppkey +
         o->lineorders[i].partkey +
         o->lineorders[i].custkey +
         (long)o->lineorders[i].linenumber + o->lineorders[i].okey + tdefs[5].vtotal;
    for (xx = o->lineorders[i].orderdate; *xx != '\0'; xx = xx + 1) {
      tdefs[5].vtotal = (long)*xx + tdefs[5].vtotal;
    }
    for (xx_1 = o->lineorders[i].opriority; *xx_1 != '\0'; xx_1 = xx_1 + 1) {
      tdefs[5].vtotal = (long)*xx_1 + tdefs[5].vtotal;
    }
    tdefs[5].vtotal =
         o->lineorders[i].tax +
         o->lineorders[i].supp_cost +
         o->lineorders[i].revenue +
         o->lineorders[i].discount +
         o->lineorders[i].order_totalprice +
         o->lineorders[i].extended_price +
         o->lineorders[i].quantity + o->lineorders[i].ship_priority + tdefs[5].vtotal;
    for (xx_2 = o->lineorders[i].commit_date; *xx_2 != '\0'; xx_2 = xx_2 + 1) {
      tdefs[5].vtotal = (long)*xx_2 + tdefs[5].vtotal;
    }
    for (xx_3 = o->lineorders[i].shipmode; *xx_3 != '\0'; xx_3 = xx_3 + 1) {
      tdefs[5].vtotal = (long)*xx_3 + tdefs[5].vtotal;
    }
  }
  return 0;
}

Assistant:

int
vrf_line(order_t *o, int mode)
{
    int i;

    UNUSED(mode);
    for (i = 0; i < o->lines; i++)
        {
	    VRF_STRT(LINE);
	    VRF_HUGE(LINE, o->lineorders[i].okey);
	    VRF_INT(LINE, o->lineorders[i].linenumber);
	    VRF_INT(LINE, o->lineorders[i].custkey);
	    VRF_INT(LINE, o->lineorders[i].partkey);
	    VRF_INT(LINE, o->lineorders[i].suppkey);
	    VRF_STR(LINE, o->lineorders[i].orderdate);
	    VRF_STR(LINE, o->lineorders[i].opriority);
	    VRF_INT(LINE, o->lineorders[i].ship_priority);
	    VRF_INT(LINE, o->lineorders[i].quantity);
	    VRF_INT(LINE, o->lineorders[i].extended_price);
	    VRF_INT(LINE, o->lineorders[i].order_totalprice);
	    VRF_INT(LINE, o->lineorders[i].discount);
	    VRF_INT(LINE, o->lineorders[i].revenue);
	    VRF_INT(LINE, o->lineorders[i].supp_cost);
	    VRF_INT(LINE, o->lineorders[i].tax);
	    VRF_STR(LINE, o->lineorders[i].commit_date);
	    VRF_STR(LINE, o->lineorders[i].shipmode);
	    VRF_END(LINE);
        }

    return(0);
}